

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

void __thiscall
RuntimeObjectSystem::AddToRuntimeFileListImp
          (RuntimeObjectSystem *this,Path *filename,unsigned_short projectId_)

{
  IFileChangeNotifier *pIVar1;
  bool bVar2;
  char *pcVar3;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  local_48;
  Path *local_40;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  local_38;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  local_30;
  iterator it;
  ProjectSettings *project;
  unsigned_short projectId__local;
  Path *filename_local;
  RuntimeObjectSystem *this_local;
  
  it._M_current = (Path *)GetProject(this,projectId_);
  local_38._M_current =
       (Path *)std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::begin
                         (&((ProjectSettings *)it._M_current)->m_RuntimeFileList);
  local_40 = (Path *)std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::end
                               ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                 *)(it._M_current + 6));
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<FileSystemUtils::Path*,std::vector<FileSystemUtils::Path,std::allocator<FileSystemUtils::Path>>>,FileSystemUtils::Path>
                       (local_38,(__normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
                                  )local_40,filename);
  local_48._M_current =
       (Path *)std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::end
                         (it._M_current + 6);
  bVar2 = __gnu_cxx::operator==(&local_30,&local_48);
  if (bVar2) {
    std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::push_back
              ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)
               (it._M_current + 6),filename);
    pIVar1 = this->m_pFileChangeNotifier;
    pcVar3 = FileSystemUtils::Path::c_str(filename);
    (**(code **)(*(long *)pIVar1 + 0x38))(pIVar1,pcVar3,&this->super_IFileChangeListener);
  }
  return;
}

Assistant:

void RuntimeObjectSystem::AddToRuntimeFileListImp( const FileSystemUtils::Path& filename, unsigned short projectId_ )
{
    ProjectSettings& project = GetProject( projectId_ );
    TFileList::iterator it = std::find( project.m_RuntimeFileList.begin( ), project.m_RuntimeFileList.end( ), filename );
    if( it == project.m_RuntimeFileList.end( ) )
	{
        project.m_RuntimeFileList.push_back( filename );
        m_pFileChangeNotifier->Watch( filename.c_str(), this );
	}
}